

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_2_params(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIP_node_push_child(G->val[-2],G->val[-1]);
  G->ss = G->val[-2];
  return;
}

Assistant:

YY_ACTION(void) yy_2_params(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v1 G->val[-1]
#define v G->val[-2]
  yyprintf((stderr, "do yy_2_params"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {PVIP_node_push_child(v, v1); yy=v; }\n"));
  PVIP_node_push_child(v, v1); yy=v; ;
#undef v1
#undef v
}